

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * pack11_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  uVar2 = (in[1] - base) * 0x800 | uVar1 - base;
  *out = uVar2;
  *out = (in[2] - base) * 0x400000 | uVar2;
  uVar2 = in[2] - base >> 10;
  out[1] = uVar2;
  uVar2 = (in[3] - base) * 2 | uVar2;
  out[1] = uVar2;
  uVar2 = (in[4] - base) * 0x1000 | uVar2;
  out[1] = uVar2;
  out[1] = (in[5] - base) * 0x800000 | uVar2;
  uVar2 = in[5] - base >> 9;
  out[2] = uVar2;
  uVar2 = (in[6] - base) * 4 | uVar2;
  out[2] = uVar2;
  uVar2 = (in[7] - base) * 0x2000 | uVar2;
  out[2] = uVar2;
  out[2] = (in[8] - base) * 0x1000000 | uVar2;
  uVar2 = in[8] - base >> 8;
  out[3] = uVar2;
  uVar2 = (in[9] - base) * 8 | uVar2;
  out[3] = uVar2;
  uVar2 = (in[10] - base) * 0x4000 | uVar2;
  out[3] = uVar2;
  out[3] = (in[0xb] - base) * 0x2000000 | uVar2;
  uVar2 = in[0xb] - base >> 7;
  out[4] = uVar2;
  uVar2 = (in[0xc] - base) * 0x10 | uVar2;
  out[4] = uVar2;
  uVar2 = (in[0xd] - base) * 0x8000 | uVar2;
  out[4] = uVar2;
  out[4] = (in[0xe] - base) * 0x4000000 | uVar2;
  uVar2 = in[0xe] - base >> 6;
  out[5] = uVar2;
  out[5] = (in[0xf] - base) * 0x20 | uVar2;
  return out + 6;
}

Assistant:

uint32_t * pack11_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 11  -  1 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 11  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 11  -  3 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  3 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 11  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  15 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 11  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;

    return out + 1;
}